

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

size_t __thiscall
MADPComponentDiscreteObservations::GetNrObservations
          (MADPComponentDiscreteObservations *this,Index agentI)

{
  pointer puVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"MADPComponentDiscreteObservations::GetNrObservations(",0x35);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - Error: not initialized. ",0x1c);
    std::endl<char,std::char_traits<char>>(poVar2);
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar3 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar3,&E::typeinfo,E::~E);
  }
  puVar1 = (this->_m_nrObservations).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)agentI <
      (ulong)((long)(this->_m_nrObservations).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return puVar1[agentI];
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Warning: MADPComponentDiscreteObservations::GetNrObservations(",0x3e);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - index out of bounds",0x17);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteObservations::GetNrObservations(Index agentI) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::GetNrObservations("<< 
            agentI<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(agentI < _m_nrObservations.size())
        return _m_nrObservations[agentI];
    else
    {
        stringstream ss;
        ss << "Warning: MADPComponentDiscreteObservations::GetNrObservations("<<
            agentI<<") - index out of bounds"<<endl;
        throw E(ss);
    }
}